

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

DuckTransactionManager * duckdb::DuckTransactionManager::Get(AttachedDatabase *db)

{
  int iVar1;
  DuckTransactionManager *pDVar2;
  InternalException *this;
  string local_40;
  
  pDVar2 = (DuckTransactionManager *)TransactionManager::Get(db);
  iVar1 = (*(pDVar2->super_TransactionManager)._vptr_TransactionManager[6])(pDVar2);
  if ((char)iVar1 != '\0') {
    return pDVar2;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Calling DuckTransactionManager::Get on non-DuckDB transaction manager","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DuckTransactionManager &DuckTransactionManager::Get(AttachedDatabase &db) {
	auto &transaction_manager = TransactionManager::Get(db);
	if (!transaction_manager.IsDuckTransactionManager()) {
		throw InternalException("Calling DuckTransactionManager::Get on non-DuckDB transaction manager");
	}
	return reinterpret_cast<DuckTransactionManager &>(transaction_manager);
}